

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addChunk_tIME(ucvector *out,LodePNGTime *time)

{
  ushort uVar1;
  uint uVar2;
  uint extraout_EAX;
  ushort *data;
  
  data = (ushort *)malloc(7);
  if (data != (ushort *)0x0) {
    uVar1 = (ushort)time->year;
    *data = uVar1 << 8 | uVar1 >> 8;
    *(char *)(data + 1) = (char)time->month;
    *(char *)((long)data + 3) = (char)time->day;
    *(char *)(data + 2) = (char)time->hour;
    *(char *)((long)data + 5) = (char)time->minute;
    *(char *)(data + 3) = (char)time->second;
    uVar2 = lodepng_chunk_create(&out->data,&out->size,7,"tIME",(uchar *)data);
    if (uVar2 == 0) {
      out->allocsize = out->size;
    }
    free(data);
    return extraout_EAX;
  }
  return 0;
}

Assistant:

static unsigned addChunk_tIME(ucvector* out, const LodePNGTime* time)
{
  unsigned error = 0;
  unsigned char* data = (unsigned char*)lodepng_malloc(7);
  if(!data) return 83; /*alloc fail*/
  data[0] = (unsigned char)(time->year / 256);
  data[1] = (unsigned char)(time->year % 256);
  data[2] = (unsigned char)time->month;
  data[3] = (unsigned char)time->day;
  data[4] = (unsigned char)time->hour;
  data[5] = (unsigned char)time->minute;
  data[6] = (unsigned char)time->second;
  error = addChunk(out, "tIME", data, 7);
  lodepng_free(data);
  return error;
}